

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<1,_0,_9,_2,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  float afStack_90 [6];
  float local_78 [2];
  undefined8 local_70;
  undefined4 local_68;
  Matrix<float,_3,_3> local_5c;
  Matrix<float,_3,_3> local_38;
  
  pfVar1 = (float *)&local_38;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[2] = 0.0;
  local_38.m_data.m_data[2].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[2] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[2] = 0.0;
  puVar2 = &s_constInMat3;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 3);
  afStack_90[0] = 2.2017515e-38;
  afStack_90[1] = 0.0;
  tcu::operator-(&local_5c,&local_38,(evalCtx->coords).m_data[0]);
  local_70 = (ulong)local_70._4_4_ << 0x20;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  lVar3 = 0;
  do {
    local_78[lVar3] =
         local_5c.m_data.m_data[0].m_data[lVar3] + local_5c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_90[4] = 0.0;
  afStack_90[2] = 0.0;
  afStack_90[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_90[lVar3 + 2] =
         local_78[lVar3] + *(float *)((long)(local_38.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_70 = 0x100000000;
  local_68 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_78[lVar3]] = afStack_90[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}